

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedDeepImageChannel<Imath_3_2::half>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<Imath_3_2::half> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  void *pvVar1;
  _func_int *p_Var2;
  undefined1 auVar3 [16];
  SampleCountChannel *this_00;
  size_t sVar4;
  ulong uVar5;
  void *pvVar6;
  half *phVar7;
  _func_int *p_Var8;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  ImageChannel *in_RDI;
  uint j_2;
  uint j_1;
  uint j;
  half *newSampleList;
  half *oldSampleList;
  size_t i;
  half *oldSampleBuffer;
  undefined8 in_stack_ffffffffffffff98;
  half *this_01;
  uint local_4c;
  uint local_48;
  uint local_44;
  half *local_30;
  
  pvVar1 = *(void **)&in_RDI[1]._xSampling;
  this_00 = DeepImageChannel::sampleCounts((DeepImageChannel *)0x123ea0);
  sVar4 = SampleCountChannel::sampleBufferSize(this_00);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(2),0);
  if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  *(void **)&in_RDI[1]._xSampling = pvVar6;
  local_30 = (half *)0x0;
  while (this_01 = local_30, phVar7 = (half *)ImageChannel::numPixels(in_RDI), this_01 < phVar7) {
    p_Var2 = in_RDI[1]._vptr_ImageChannel[(long)local_30];
    p_Var8 = (_func_int *)
             (*(long *)&in_RDI[1]._xSampling + *(long *)(in_RCX + (long)local_30 * 8) * 2);
    if (*(uint *)(in_RDX + (long)local_30 * 4) < *(uint *)(in_RSI + (long)local_30 * 4)) {
      for (local_44 = 0; local_44 < *(uint *)(in_RDX + (long)local_30 * 4); local_44 = local_44 + 1)
      {
        *(undefined2 *)(p_Var8 + (ulong)local_44 * 2) =
             *(undefined2 *)(p_Var2 + (ulong)local_44 * 2);
      }
    }
    else {
      for (local_48 = 0; local_48 < *(uint *)(in_RSI + (long)local_30 * 4); local_48 = local_48 + 1)
      {
        *(undefined2 *)(p_Var8 + (ulong)local_48 * 2) =
             *(undefined2 *)(p_Var2 + (ulong)local_48 * 2);
      }
      for (local_4c = *(uint *)(in_RSI + (long)local_30 * 4);
          local_4c < *(uint *)(in_RDX + (long)local_30 * 4); local_4c = local_4c + 1) {
        Imath_3_2::half::operator=(this_01,(float)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
    }
    in_RDI[1]._vptr_ImageChannel[(long)local_30] = p_Var8;
    local_30 = (half *)((long)&local_30->_h + 1);
  }
  if (pvVar1 != (void *)0x0) {
    operator_delete__(pvVar1);
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer (
    const unsigned int* oldNumSamples,
    const unsigned int* newNumSamples,
    const size_t*       newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T* oldSampleBuffer = _sampleBuffer;
    _sampleBuffer      = new T[sampleCounts ().sampleBufferSize ()];

    for (size_t i = 0; i < numPixels (); ++i)
    {
        T* oldSampleList = _sampleListPointers[i];
        T* newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete[] oldSampleBuffer;
}